

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O1

void __thiscall neural_networks::utilities::Matrix<long_double>::print(Matrix<long_double> *this)

{
  ostream *poVar1;
  ulong uVar2;
  long lVar3;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (this->N != 0) {
    local_38 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
      if (this->M != 0) {
        lVar3 = 0;
        uVar2 = 0;
        do {
          poVar1 = std::ostream::_M_insert<long_double>
                             (*(longdouble *)
                               (*(long *)&(this->matrix).
                                          super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[local_38].
                                          super__Vector_base<long_double,_std::allocator<long_double>_>
                                          ._M_impl.super__Vector_impl_data + lVar3));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          uVar2 = uVar2 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar2 < this->M);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]\n",2);
      local_38 = local_38 + 1;
    } while (local_38 < this->N);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  return;
}

Assistant:

void neural_networks::utilities::Matrix<T>::print() const {
    std::cout << "\n";
    size_t i, j;
    for(i = 0; i < N; ++i) {
        std::cout << "[ ";
        for(j = 0; j < M; ++j) {
            std::cout << matrix[i][j] << " ";
        }
        std::cout << "]\n";
    }
    std::cout << std::endl;
}